

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

Region * __thiscall
TuxProc::Process::getRegion(Process *this,char *regionName,int index,uint8_t filter)

{
  pointer pRVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *__s2;
  int iVar5;
  Region *region;
  pointer this_00;
  Region *local_38;
  
  this_00 = (this->regions).super__Vector_base<TuxProc::Region,_std::allocator<TuxProc::Region>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->regions).super__Vector_base<TuxProc::Region,_std::allocator<TuxProc::Region>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pRVar1) {
    iVar5 = 0;
    do {
      bVar3 = Region::getMode(this_00);
      bVar2 = true;
      if ((filter & ~bVar3) == 0) {
        __s2 = Region::getFileName(this_00);
        iVar4 = strcmp(regionName,__s2);
        if (iVar4 == 0) {
          if (iVar5 == index) {
            bVar2 = false;
            local_38 = this_00;
          }
          else {
            iVar5 = iVar5 + 1;
          }
        }
      }
      if (!bVar2) {
        return local_38;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pRVar1);
  }
  return (Region *)0x0;
}

Assistant:

Region* Process::getRegion(const char* regionName, int index, uint8_t filter)
{
    int counter = 0;
    for (Region& region : regions) {
        if (((filter & region.getMode()) == filter) && (strcmp(regionName, region.getFileName()) == 0)) {
            if (counter == index) return &region;
            else counter++;
        }
    }
    return nullptr;
}